

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O3

void loop_undo(jit_State *J,IRRef ins,SnapNo nsnap,MSize nsnapmap)

{
  byte *pbVar1;
  ushort uVar2;
  SnapShot *pSVar3;
  SnapEntry *pSVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [16];
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pSVar3 = (J->cur).snap;
  pSVar4 = (J->cur).snapmap;
  pSVar4[(uint)pSVar3[nsnap - 1].nent + pSVar3[nsnap - 1].mapofs] = pSVar4[pSVar3->nent];
  (J->cur).nsnapmap = nsnapmap;
  (J->cur).nsnap = (uint16_t)nsnap;
  (J->guardemit).irt = '\0';
  lj_ir_rollback(J,ins);
  auVar9 = _DAT_00160550;
  auVar12._4_4_ = ins;
  auVar12._0_4_ = ins;
  auVar12._8_4_ = ins;
  auVar12._12_4_ = ins;
  lVar10 = 0;
  auVar12 = auVar12 ^ _DAT_00160550;
  do {
    uVar2 = J->bpropcache[lVar10 + 3].val;
    auVar5._12_2_ = uVar2;
    auVar5._0_12_ = ZEXT212(uVar2) << 0x30;
    auVar7._6_8_ = 0;
    auVar7._0_6_ = (uint6)(CONCAT44(auVar5._10_4_,CONCAT22(J->bpropcache[lVar10 + 2].val,uVar2)) >>
                          0x10);
    auVar15._6_8_ = SUB148(auVar7 << 0x40,6);
    auVar15._4_2_ = J->bpropcache[lVar10 + 1].val;
    auVar15._2_2_ = 0;
    auVar15._0_2_ = J->bpropcache[lVar10].val;
    auVar15._14_2_ = 0;
    auVar15 = auVar15 | auVar9;
    auVar14._0_4_ = -(uint)(auVar15._0_4_ < auVar12._0_4_);
    auVar14._4_4_ = -(uint)(auVar15._4_4_ < auVar12._4_4_);
    auVar14._8_4_ = -(uint)(auVar15._8_4_ < auVar12._8_4_);
    auVar14._12_4_ = -(uint)(auVar15._12_4_ < auVar12._12_4_);
    if ((~auVar14._0_4_ & 1) != 0) {
      J->bpropcache[lVar10].key = 0;
    }
    auVar15 = pshuflw(auVar15,auVar14,0xaa);
    if ((~auVar15._0_4_ >> 0x10 & 1) != 0) {
      J->bpropcache[lVar10 + 1].key = 0;
    }
    if ((((ushort)auVar14._8_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar10 + 2].key = 0;
    }
    if ((((ushort)auVar14._12_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar10 + 3].key = 0;
    }
    uVar2 = J->bpropcache[lVar10 + 7].val;
    auVar6._12_2_ = uVar2;
    auVar6._0_12_ = ZEXT212(uVar2) << 0x30;
    auVar8._6_8_ = 0;
    auVar8._0_6_ = (uint6)(CONCAT44(auVar6._10_4_,CONCAT22(J->bpropcache[lVar10 + 6].val,uVar2)) >>
                          0x10);
    auVar16._6_8_ = SUB148(auVar8 << 0x40,6);
    auVar16._4_2_ = J->bpropcache[lVar10 + 5].val;
    auVar16._2_2_ = 0;
    auVar16._0_2_ = J->bpropcache[lVar10 + 4].val;
    auVar16._14_2_ = 0;
    auVar16 = auVar16 | auVar9;
    auVar13._0_4_ = -(uint)(auVar16._0_4_ < auVar12._0_4_);
    auVar13._4_4_ = -(uint)(auVar16._4_4_ < auVar12._4_4_);
    auVar13._8_4_ = -(uint)(auVar16._8_4_ < auVar12._8_4_);
    auVar13._12_4_ = -(uint)(auVar16._12_4_ < auVar12._12_4_);
    if ((((ushort)auVar13._0_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar10 + 4].key = 0;
    }
    if ((((ushort)auVar13._4_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar10 + 5].key = 0;
    }
    if ((((ushort)auVar13._8_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar10 + 6].key = 0;
    }
    auVar14 = pshufhw(auVar13,auVar13,0xaa);
    if (((auVar14._14_2_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar10 + 7].key = 0;
    }
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x10);
  if (0x8000 < ins - 1) {
    uVar11 = (ulong)(ins - 1);
    do {
      pbVar1 = (byte *)((long)(J->cur).ir + uVar11 * 8 + 4);
      *pbVar1 = *pbVar1 & 0x9f;
      uVar11 = uVar11 - 1;
    } while (0x8000 < (uint)uVar11);
  }
  return;
}

Assistant:

static void loop_undo(jit_State *J, IRRef ins, SnapNo nsnap, MSize nsnapmap)
{
  ptrdiff_t i;
  SnapShot *snap = &J->cur.snap[nsnap-1];
  SnapEntry *map = J->cur.snapmap;
  map[snap->mapofs + snap->nent] = map[J->cur.snap[0].nent];  /* Restore PC. */
  J->cur.nsnapmap = (uint32_t)nsnapmap;
  J->cur.nsnap = nsnap;
  J->guardemit.irt = 0;
  lj_ir_rollback(J, ins);
  for (i = 0; i < BPROP_SLOTS; i++) {  /* Remove backprop. cache entries. */
    BPropEntry *bp = &J->bpropcache[i];
    if (bp->val >= ins)
      bp->key = 0;
  }
  for (ins--; ins >= REF_FIRST; ins--) {  /* Remove flags. */
    IRIns *ir = IR(ins);
    irt_clearphi(ir->t);
    irt_clearmark(ir->t);
  }
}